

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall fmt::v9::detail::bigint::square(bigint *this)

{
  byte bVar1;
  ulong uVar2;
  type tVar3;
  uint uVar4;
  size_t sVar5;
  uint *puVar6;
  bigit *pbVar7;
  ulong uVar8;
  bool bVar9;
  int local_100;
  int local_fc;
  int i_1;
  int j_1;
  int bigit_index_1;
  int j;
  int i;
  int bigit_index;
  uint128_t sum;
  undefined1 local_c0 [8];
  basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_> n;
  int num_result_bigits;
  int num_bigits;
  bigint *this_local;
  
  sVar5 = buffer<unsigned_int>::size((buffer<unsigned_int> *)this);
  n._164_4_ = SUB84(sVar5,0);
  n._160_4_ = n._164_4_ * 2;
  basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_>::basic_memory_buffer
            ((basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_> *)local_c0,
             &this->bigits_);
  tVar3 = to_unsigned<int>(n._160_4_);
  basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_>::resize
            (&this->bigits_,(ulong)tVar3);
  sum._0_8_ = 0;
  _i = 0;
  for (j = 0; j < (int)n._164_4_; j = j + 1) {
    bigit_index_1 = 0;
    for (j_1 = j; -1 < j_1; j_1 = j_1 + -1) {
      puVar6 = buffer<unsigned_int>::operator[]<int>((buffer<unsigned_int> *)local_c0,bigit_index_1)
      ;
      uVar4 = *puVar6;
      puVar6 = buffer<unsigned_int>::operator[]<int>((buffer<unsigned_int> *)local_c0,j_1);
      bVar9 = CARRY8(_i,(ulong)uVar4 * (ulong)*puVar6);
      _i = _i + (ulong)uVar4 * (ulong)*puVar6;
      sum._0_8_ = (ulong)sum + bVar9;
      bigit_index_1 = bigit_index_1 + 1;
    }
    pbVar7 = operator[](this,j);
    *pbVar7 = i;
    uVar4 = num_bits<unsigned_int>();
    uVar8 = (ulong)sum >> ((byte)uVar4 & 0x3f);
    bVar1 = (byte)uVar4 & 0x3f;
    uVar2 = (ulong)sum << 0x40 - bVar1;
    sum._0_8_ = uVar8;
    _i = _i >> bVar1 | uVar2;
    if ((uVar4 & 0x40) != 0) {
      sum._0_8_ = 0;
      _i = uVar8;
    }
  }
  for (i_1 = n._164_4_; i_1 < (int)n._160_4_; i_1 = i_1 + 1) {
    local_100 = i_1 - (n._164_4_ + -1);
    local_fc = n._164_4_ + -1;
    while (local_100 < (int)n._164_4_) {
      puVar6 = buffer<unsigned_int>::operator[]<int>((buffer<unsigned_int> *)local_c0,local_100);
      uVar4 = *puVar6;
      puVar6 = buffer<unsigned_int>::operator[]<int>((buffer<unsigned_int> *)local_c0,local_fc);
      bVar9 = CARRY8(_i,(ulong)uVar4 * (ulong)*puVar6);
      _i = _i + (ulong)uVar4 * (ulong)*puVar6;
      sum._0_8_ = (ulong)sum + bVar9;
      local_100 = local_100 + 1;
      local_fc = local_fc + -1;
    }
    pbVar7 = operator[](this,i_1);
    *pbVar7 = i;
    uVar4 = num_bits<unsigned_int>();
    uVar8 = (ulong)sum >> ((byte)uVar4 & 0x3f);
    bVar1 = (byte)uVar4 & 0x3f;
    uVar2 = (ulong)sum << 0x40 - bVar1;
    sum._0_8_ = uVar8;
    _i = _i >> bVar1 | uVar2;
    if ((uVar4 & 0x40) != 0) {
      sum._0_8_ = 0;
      _i = uVar8;
    }
  }
  remove_leading_zeros(this);
  this->exp_ = this->exp_ << 1;
  basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_>::~basic_memory_buffer
            ((basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_> *)local_c0);
  return;
}

Assistant:

FMT_CONSTEXPR20 void square() {
    int num_bigits = static_cast<int>(bigits_.size());
    int num_result_bigits = 2 * num_bigits;
    basic_memory_buffer<bigit, bigits_capacity> n(std::move(bigits_));
    bigits_.resize(to_unsigned(num_result_bigits));
    auto sum = uint128_t();
    for (int bigit_index = 0; bigit_index < num_bigits; ++bigit_index) {
      // Compute bigit at position bigit_index of the result by adding
      // cross-product terms n[i] * n[j] such that i + j == bigit_index.
      for (int i = 0, j = bigit_index; j >= 0; ++i, --j) {
        // Most terms are multiplied twice which can be optimized in the future.
        sum += static_cast<double_bigit>(n[i]) * n[j];
      }
      (*this)[bigit_index] = static_cast<bigit>(sum);
      sum >>= num_bits<bigit>();  // Compute the carry.
    }
    // Do the same for the top half.
    for (int bigit_index = num_bigits; bigit_index < num_result_bigits;
         ++bigit_index) {
      for (int j = num_bigits - 1, i = bigit_index - j; i < num_bigits;)
        sum += static_cast<double_bigit>(n[i++]) * n[j--];
      (*this)[bigit_index] = static_cast<bigit>(sum);
      sum >>= num_bits<bigit>();
    }
    remove_leading_zeros();
    exp_ *= 2;
  }